

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_converter.h
# Opt level: O0

bool date::date_converter<date::rfc3339,_long,_void>::from_parts(parts *parts,time_t *timepoint)

{
  seconds_count sVar1;
  date_time local_38 [2];
  seconds_count seconds_count;
  seconds_count local_20;
  seconds_count epoch_offset;
  time_t *timepoint_local;
  parts *parts_local;
  
  epoch_offset = (seconds_count)timepoint;
  timepoint_local = (time_t *)parts;
  calendar_helper::date_time::date_time
            ((date_time *)&seconds_count,0x7b2,'\x01','\x01','\0','\0','\0');
  local_20 = calendar_helper::to_seconds_count((date_time *)&seconds_count);
  calendar_helper::date_time::date_time
            (local_38,(year_type)*timepoint_local,*(month_type *)((long)timepoint_local + 2),
             *(day_type *)((long)timepoint_local + 3),*(hour_type *)((long)timepoint_local + 4),
             *(minute_type *)((long)timepoint_local + 5),*(second_type *)((long)timepoint_local + 6)
            );
  sVar1 = calendar_helper::to_seconds_count(local_38);
  *(seconds_count *)epoch_offset =
       (sVar1 - (long)(*(short *)((long)timepoint_local + 0xc) * 0x3c)) - local_20;
  return true;
}

Assistant:

static bool from_parts(const rfc3339::parts& parts, std::time_t& timepoint)
    {
        using date_time = calendar_helper::date_time;
        const auto epoch_offset = calendar_helper::to_seconds_count(date_time{ 1970, 1, 1, 0, 0, 0 });
        const auto seconds_count = calendar_helper::to_seconds_count(date_time{ parts.year, parts.month, parts.day, parts.hour, parts.minute, parts.second });
        timepoint = static_cast<std::time_t>(seconds_count - parts.offset_in_minutes * 60 - epoch_offset);
        return true;
    }